

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

bool tinyusdz::anon_unknown_160::CompositeSublayersRec
               (AssetResolutionResolver *resolver,Layer *in_layer,
               vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *layer_names_stack,Layer *composited_layer,string *warn,string *err,
               SublayersCompositionOptions *options)

{
  Layer *pLVar1;
  bool bVar2;
  size_type sVar3;
  reference this;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  *this_00;
  reference primname;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  *this_01;
  mapped_type *dst;
  LayerMetas *pLVar4;
  string *psVar5;
  ulong uVar6;
  ostream *poVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1e40;
  _Base_ptr local_1e28;
  undefined1 local_1e20;
  string local_1e18 [39];
  allocator local_1df1;
  string local_1df0;
  string local_1dd0;
  ostringstream local_1db0 [8];
  ostringstream ss_e_2;
  Path local_1c38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b68;
  string local_1b50;
  undefined1 local_1b30 [8];
  Layer sublayer;
  string local_518;
  allocator local_4f1;
  string local_4f0 [32];
  string local_4d0;
  ostringstream local_4b0 [8];
  ostringstream ss_e_1;
  undefined1 local_338 [8];
  string layer_filepath;
  string local_310 [32];
  string local_2f0;
  allocator local_2c9;
  string local_2c8 [32];
  string local_2a8;
  ostringstream local_288 [8];
  ostringstream ss_e;
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_110;
  undefined1 local_f8 [8];
  string sublayer_asset_path;
  SubLayer *layer;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *__range2_1;
  value_type *prim;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *curr_layer_names;
  string *local_60;
  string *err_local;
  string *warn_local;
  Layer *composited_layer_local;
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *layer_names_stack_local;
  Layer *in_layer_local;
  AssetResolutionResolver *resolver_local;
  
  local_60 = err;
  err_local = warn;
  warn_local = &composited_layer->_name;
  composited_layer_local = (Layer *)layer_names_stack;
  layer_names_stack_local =
       (vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        *)in_layer;
  in_layer_local = (Layer *)resolver;
  sVar3 = ::std::
          vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::size(layer_names_stack);
  if (options->max_depth < sVar3) {
    if (local_60 != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)local_60,"subLayer is nested too deeply.");
    }
    resolver_local._7_1_ = 0;
  }
  else {
    memset(&curr_layer_names,0,0x30);
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&curr_layer_names);
    ::std::
    vector<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::allocator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>
    ::
    emplace_back<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
              ((vector<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::allocator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>
                *)layer_names_stack,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&curr_layer_names);
    ::std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&curr_layer_names);
    this = ::std::
           vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::back(layer_names_stack);
    this_00 = Layer::primspecs_abi_cxx11_((Layer *)layer_names_stack_local);
    __end2 = ::std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
             ::begin(this_00);
    prim = (value_type *)
           ::std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
           ::end(this_00);
    while (bVar2 = std::__detail::operator!=
                             ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
                               *)&__end2,
                              (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_true>
                               *)&prim), bVar2) {
      primname = ::std::__detail::
                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_false,_true>
                 ::operator*(&__end2);
      bVar2 = Layer::has_primspec((Layer *)warn_local,(string *)primname);
      if (bVar2) {
        this_01 = Layer::primspecs_abi_cxx11_((Layer *)warn_local);
        dst = ::std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
              ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                    *)this_01,&primname->first);
        warn = local_60;
        bVar2 = CombinePrimSpecRec(0,dst,&primname->second,err_local,local_60);
        if (!bVar2) {
          resolver_local._7_1_ = 0;
          goto LAB_00216ca1;
        }
      }
      else {
        Layer::add_primspec((Layer *)warn_local,(string *)primname,&primname->second);
      }
      ::std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_false,_true>
      ::operator++(&__end2);
    }
    pLVar4 = Layer::metas((Layer *)layer_names_stack_local);
    __end2_1._M_current =
         (SubLayer *)
         std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::begin
                   ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)
                    &pLVar4->subLayers);
    layer = (SubLayer *)
            std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>::end
                      ((vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_> *)
                       &pLVar4->subLayers);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_tinyusdz::SubLayer_*,_std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>_>
                               *)&layer), bVar2) {
      sublayer_asset_path.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_tinyusdz::SubLayer_*,_std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>_>
           ::operator*(&__end2_1);
      psVar5 = tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_
                         ((AssetPath *)sublayer_asset_path.field_2._8_8_);
      ::std::__cxx11::string::string((string *)local_f8,(string *)psVar5);
      ::std::
      vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::vector(&local_110,layer_names_stack);
      bVar2 = IsVisited(&local_110,(string *)local_f8);
      ::std::
      vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_110);
      if (bVar2) {
        ::std::__cxx11::ostringstream::ostringstream(local_288);
        poVar7 = ::std::operator<<((ostream *)local_288,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"CompositeSublayersRec");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1e8);
        ::std::operator<<(poVar7," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2c8,"Circular referenceing detected for subLayer: {} in {}",&local_2c9);
        Layer::name_abi_cxx11_(&local_2f0,(Layer *)layer_names_stack_local);
        fmt::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_2a8,(fmt *)local_2c8,(string *)local_f8,&local_2f0,warn);
        poVar7 = ::std::operator<<((ostream *)local_288,(string *)&local_2a8);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::string::~string((string *)&local_2a8);
        ::std::__cxx11::string::~string((string *)&local_2f0);
        ::std::__cxx11::string::~string(local_2c8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
        if (local_60 != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)local_60,local_310);
          ::std::__cxx11::string::~string(local_310);
        }
        resolver_local._7_1_ = 0;
        layer_filepath.field_2._12_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_288);
      }
      else {
        AssetResolutionResolver::resolve
                  ((string *)local_338,(AssetResolutionResolver *)in_layer_local,(string *)local_f8)
        ;
        uVar6 = ::std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          Layer::Layer((Layer *)local_1b30);
          pLVar1 = in_layer_local;
          Layer::get_current_working_path_abi_cxx11_(&local_1b50,(Layer *)layer_names_stack_local);
          Layer::get_asset_search_paths_abi_cxx11_(&local_1b68,(Layer *)layer_names_stack_local);
          warn = (string *)sublayer_asset_path.field_2._8_8_;
          Path::make_root_path();
          bVar2 = LoadAsset((AssetResolutionResolver *)pLVar1,&local_1b50,&local_1b68,
                            &options->fileformats,(AssetPath *)warn,&local_1c38,(Layer *)local_1b30,
                            (PrimSpec **)0x0,(bool)(options->error_when_no_prims_in_sublayer & 1),
                            (bool)(options->error_when_asset_not_found & 1),
                            (bool)(options->error_when_unsupported_fileformat & 1),err_local,
                            local_60);
          Path::~Path(&local_1c38);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1b68);
          ::std::__cxx11::string::~string((string *)&local_1b50);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            pVar8 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert(this,(value_type *)local_f8);
            pLVar1 = in_layer_local;
            local_1e28 = (_Base_ptr)pVar8.first._M_node;
            local_1e20 = pVar8.second;
            ::std::
            vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::vector(&local_1e40,layer_names_stack);
            warn = err_local;
            bVar2 = CompositeSublayersRec
                              ((AssetResolutionResolver *)pLVar1,(Layer *)local_1b30,&local_1e40,
                               (Layer *)warn_local,err_local,local_60,options);
            ::std::
            vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::~vector(&local_1e40);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              layer_filepath.field_2._12_4_ = 0;
            }
            else {
              resolver_local._7_1_ = 0;
              layer_filepath.field_2._12_4_ = 1;
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1db0);
            poVar7 = ::std::operator<<((ostream *)local_1db0,"[error]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"CompositeSublayersRec");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1fb);
            ::std::operator<<(poVar7," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_1df0,"Load asset in subLayer failed: `{}`",&local_1df1);
            fmt::format<tinyusdz::value::AssetPath>
                      (&local_1dd0,&local_1df0,(AssetPath *)sublayer_asset_path.field_2._8_8_);
            poVar7 = ::std::operator<<((ostream *)local_1db0,(string *)&local_1dd0);
            ::std::operator<<(poVar7,"\n");
            ::std::__cxx11::string::~string((string *)&local_1dd0);
            ::std::__cxx11::string::~string((string *)&local_1df0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1df1);
            if (local_60 != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)local_60,local_1e18);
              ::std::__cxx11::string::~string(local_1e18);
            }
            resolver_local._7_1_ = 0;
            layer_filepath.field_2._12_4_ = 1;
            ::std::__cxx11::ostringstream::~ostringstream(local_1db0);
          }
          Layer::~Layer((Layer *)local_1b30);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_4b0);
          poVar7 = ::std::operator<<((ostream *)local_4b0,"[error]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"CompositeSublayersRec");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1ef);
          ::std::operator<<(poVar7," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_4f0,"{} not found in path: {}",&local_4f1);
          AssetResolutionResolver::search_paths_str_abi_cxx11_
                    (&local_518,(AssetResolutionResolver *)in_layer_local);
          fmt::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_4d0,(fmt *)local_4f0,(string *)local_f8,&local_518,warn);
          poVar7 = ::std::operator<<((ostream *)local_4b0,(string *)&local_4d0);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::~string((string *)&local_4d0);
          ::std::__cxx11::string::~string((string *)&local_518);
          ::std::__cxx11::string::~string(local_4f0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
          if (local_60 != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=
                      ((string *)local_60,(string *)&sublayer._asset_resolution_userdata);
            ::std::__cxx11::string::~string((string *)&sublayer._asset_resolution_userdata);
          }
          resolver_local._7_1_ = 0;
          layer_filepath.field_2._12_4_ = 1;
          ::std::__cxx11::ostringstream::~ostringstream(local_4b0);
        }
        ::std::__cxx11::string::~string((string *)local_338);
      }
      ::std::__cxx11::string::~string((string *)local_f8);
      if (layer_filepath.field_2._12_4_ != 0) goto LAB_00216ca1;
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::SubLayer_*,_std::vector<tinyusdz::SubLayer,_std::allocator<tinyusdz::SubLayer>_>_>
      ::operator++(&__end2_1);
    }
    ::std::
    vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::pop_back(layer_names_stack);
    resolver_local._7_1_ = 1;
  }
LAB_00216ca1:
  return (bool)(resolver_local._7_1_ & 1);
}

Assistant:

bool CompositeSublayersRec(AssetResolutionResolver &resolver,
                           const Layer &in_layer,
                           std::vector<std::set<std::string>> layer_names_stack,
                           Layer *composited_layer, std::string *warn,
                           std::string *err,
                           const SublayersCompositionOptions &options) {
  if (layer_names_stack.size() > options.max_depth) {
    if (err) {
      (*err) += "subLayer is nested too deeply.";
    }
    return false;
  }

  layer_names_stack.emplace_back(std::set<std::string>());
  std::set<std::string> &curr_layer_names = layer_names_stack.back();

  for (auto const &prim : in_layer.primspecs()) {
    if (composited_layer->has_primspec(prim.first))
    {
      if (!CombinePrimSpecRec(0, composited_layer->primspecs().at(prim.first), prim.second, warn, err)) {
        return false;
      }
    }
    else {
      composited_layer->add_primspec(prim.first, prim.second);
    }
  }

  for (const auto &layer : in_layer.metas().subLayers) {
    // TODO: subLayerOffset
    std::string sublayer_asset_path = layer.assetPath.GetAssetPath();

    // Do cyclic referencing check.
    // TODO: Use resolved name?
    if (IsVisited(layer_names_stack, sublayer_asset_path)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Circular referenceing detected for subLayer: {} in {}",
                      sublayer_asset_path, in_layer.name()));
    }

    std::string layer_filepath = resolver.resolve(sublayer_asset_path);
    if (layer_filepath.empty()) {
      PUSH_ERROR_AND_RETURN(fmt::format("{} not found in path: {}",
                                        sublayer_asset_path,
                                        resolver.search_paths_str()));
    }

    tinyusdz::Layer sublayer;
    if (!LoadAsset(resolver, in_layer.get_current_working_path(),
                   in_layer.get_asset_search_paths(), options.fileformats,
                   layer.assetPath, /* not_used */ Path::make_root_path(),
                   &sublayer, /* primspec_root */ nullptr,
                   options.error_when_no_prims_in_sublayer,
                   options.error_when_asset_not_found,
                   options.error_when_unsupported_fileformat, warn, err)) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Load asset in subLayer failed: `{}`", layer.assetPath));
    }

    curr_layer_names.insert(sublayer_asset_path);

    // Recursively load subLayer
    if (!CompositeSublayersRec(resolver, sublayer, layer_names_stack,
                               composited_layer, warn, err, options)) {
      return false;
    }
  }

  layer_names_stack.pop_back();

  return true;
}